

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_offsetsurface.cpp
# Opt level: O0

void __thiscall
ON_BumpFunction::Evaluate(ON_BumpFunction *this,double s,double t,int der_count,double *value)

{
  double dt;
  double dt_00;
  double **value_00;
  double dVar1;
  double dVar2;
  double **local_128;
  int local_114;
  int local_110;
  int j;
  int i;
  int n;
  double dy;
  double y;
  double dx;
  double x;
  double *yvalue;
  double *xvalue;
  double tmp [20];
  double *local_30;
  double *value_local;
  int der_count_local;
  double t_local;
  double s_local;
  ON_BumpFunction *this_local;
  
  if (der_count < 10) {
    local_128 = &xvalue;
  }
  else {
    local_128 = (double **)onmalloc((long)((der_count + 1) * 2) << 3);
  }
  value_00 = local_128 + (der_count + 1);
  dVar1 = s - this->m_x0;
  dt = this->m_sx[(int)(uint)(0.0 <= dVar1)];
  dVar1 = dt * dVar1;
  dVar2 = t - this->m_y0;
  dt_00 = this->m_sy[(int)(uint)(0.0 <= dVar2)];
  dVar2 = dt_00 * dVar2;
  if (this->m_type[0] == 5) {
    Internal_EvaluateQuinticBump(this,dVar1,dt,der_count,(double *)local_128);
  }
  else {
    Internal_EvaluateLinearBump(this,dVar1,dt,der_count,(double *)local_128);
  }
  if (this->m_type[1] == 5) {
    Internal_EvaluateQuinticBump(this,dVar2,dt_00,der_count,(double *)value_00);
  }
  else {
    Internal_EvaluateLinearBump(this,dVar2,dt_00,der_count,(double *)value_00);
  }
  local_30 = value;
  for (j = 0; j <= der_count; j = j + 1) {
    local_110 = j;
    for (local_114 = 0; local_114 <= j; local_114 = local_114 + 1) {
      *local_30 = this->m_a * (double)local_128[local_110] * (double)value_00[local_114];
      local_110 = local_110 + -1;
      local_30 = local_30 + 1;
    }
  }
  return;
}

Assistant:

void ON_BumpFunction::Evaluate(double s, double t, int der_count, double* value) const
{
  double tmp[20];
  double* xvalue;
  double* yvalue;
  xvalue = ( der_count > 9 ) 
         ? ((double*)onmalloc((der_count+1)*2*sizeof(xvalue[0])))
         : &tmp[0];
  yvalue = xvalue + (der_count+1);
  double x = s-m_x0;
  const double dx = m_sx[x >= 0.0 ? 1 : 0];
  x *= dx;
  double y = t-m_y0;
  const double dy = m_sy[y >= 0.0 ? 1 : 0];
  y *= dy;

  if ( 5 == m_type[0] )
  {
    Internal_EvaluateQuinticBump(x,dx,der_count,xvalue);
  }
  else
  {
    Internal_EvaluateLinearBump(x,dx,der_count,xvalue);
  }
  if ( 5 == m_type[1] )
  {
    Internal_EvaluateQuinticBump(y,dy,der_count,yvalue);
  }
  else
  {
    Internal_EvaluateLinearBump(y,dy,der_count,yvalue);
  }

  int n, i, j;
  for ( n = 0; n <= der_count; n++ )
  {
    for ( i = n, j = 0; j <= n; i--, j++ )
    {
      *value++ = m_a*xvalue[i]*yvalue[j]; // d^nf/(ds^i dt^j)
    }
  }
}